

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  ulong uVar1;
  string *str;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *gen_local;
  cmGlobalGenerator *this_local;
  
  local_18 = gen;
  gen_local = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)&this->ConfiguredFilesPath,(string *)&local_18->ConfiguredFilesPath);
  }
  else {
    str = cmake::GetHomeOutputDirectory_abi_cxx11_(local_18->CMakeInstance);
    cmAlphaNum::cmAlphaNum(&local_68,str);
    cmAlphaNum::cmAlphaNum(&local_98,"/CMakeFiles");
    cmStrCat<>(&local_38,&local_68,&local_98);
    std::__cxx11::string::operator=((string *)&this->ConfiguredFilesPath,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath =
      cmStrCat(gen->CMakeInstance->GetHomeOutputDirectory(), "/CMakeFiles");
  }
}